

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManCleanCioIds(Aig_Man_t *p)

{
  undefined8 *puVar1;
  int i;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(p->vCis,iVar2);
    *puVar1 = 0;
  }
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(p->vCos,iVar2);
    *puVar1 = 0;
  }
  return;
}

Assistant:

void Aig_ManCleanCioIds( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachCi( p, pObj, i )
        pObj->pNext = NULL;
    Aig_ManForEachCo( p, pObj, i )
        pObj->pNext = NULL;
}